

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall
ON_PlaneSurface::SetExtents(ON_PlaneSurface *this,int dir,ON_Interval extents,bool bSyncDomain)

{
  bool bVar1;
  ON_Interval local_28;
  
  local_28.m_t[1] = extents.m_t[1];
  local_28.m_t[0] = extents.m_t[0];
  if (((uint)dir < 2) && (bVar1 = ON_Interval::IsIncreasing(&local_28), bVar1)) {
    *(double *)(&this->field_0xb0 + (ulong)(uint)dir * 0x10) = local_28.m_t[0];
    *(double *)((long)(&this->field_0xb0 + (ulong)(uint)dir * 0x10) + 8) = local_28.m_t[1];
    if (!bSyncDomain) {
      return true;
    }
    *(double *)(&this->field_0x90 + (ulong)(uint)dir * 0x10) = local_28.m_t[0];
    *(double *)((long)(&this->field_0x90 + (ulong)(uint)dir * 0x10) + 8) = local_28.m_t[1];
    return true;
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::SetExtents( 
       int dir,
       ON_Interval extents,
       bool bSyncDomain
       )
{
  if ( dir < 0 || dir > 1 || !extents.IsIncreasing() )
    return false;
  m_extents[dir] = extents;
  if ( bSyncDomain )
    m_domain[dir] = m_extents[dir];
  return true;
}